

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

void djinni_from_bottle(obj *obj)

{
  monst *mtmp_00;
  char *pcVar1;
  int local_24;
  int local_20;
  int local_1c;
  int chance;
  monst *mtmp;
  obj *obj_local;
  
  mtmp_00 = makemon(mons + 0x147,level,(int)u.ux,(int)u.uy,0);
  if (mtmp_00 == (monst *)0x0) {
    pline("It turns out to be empty.");
  }
  else {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar1 = a_monnam(mtmp_00);
      pline("In a cloud of smoke, %s emerges!",pcVar1);
      pcVar1 = Monnam(mtmp_00);
      pline("%s speaks.",pcVar1);
    }
    else {
      pline("You smell acrid fumes.");
      pline("Something speaks.");
    }
    local_1c = rn2(5);
    if ((*(uint *)&obj->field_0x4a >> 1 & 1) == 0) {
      if ((*(uint *)&obj->field_0x4a & 1) != 0) {
        if (local_1c == 0) {
          local_24 = rn2(4);
        }
        else {
          local_24 = 4;
        }
        local_1c = local_24;
      }
    }
    else {
      if (local_1c == 4) {
        local_20 = rnd(4);
      }
      else {
        local_20 = 0;
      }
      local_1c = local_20;
    }
    switch(local_1c) {
    case 0:
      verbalize("I am in your debt.  I will grant one wish!");
      makewish('\0');
      mongone(mtmp_00);
      break;
    case 1:
      verbalize("Thank you for freeing me!");
      tamedog(mtmp_00,(obj *)0x0);
      break;
    case 2:
      verbalize("You freed me!");
      *(uint *)&mtmp_00->field_0x60 = *(uint *)&mtmp_00->field_0x60 & 0xffbfffff | 0x400000;
      set_malign(mtmp_00);
      break;
    case 3:
      verbalize("It is about time!");
      pcVar1 = Monnam(mtmp_00);
      pline("%s vanishes.",pcVar1);
      mongone(mtmp_00);
      break;
    default:
      verbalize("You disturbed me, fool!");
    }
  }
  return;
}

Assistant:

void djinni_from_bottle(struct obj *obj)
{
	struct monst *mtmp;
	int chance;

	if (!(mtmp = makemon(&mons[PM_DJINNI], level, u.ux, u.uy, NO_MM_FLAGS))){
		pline("It turns out to be empty.");
		return;
	}

	if (!Blind) {
		pline("In a cloud of smoke, %s emerges!", a_monnam(mtmp));
		pline("%s speaks.", Monnam(mtmp));
	} else {
		pline("You smell acrid fumes.");
		pline("Something speaks.");
	}

	chance = rn2(5);
	if (obj->blessed) chance = (chance == 4) ? rnd(4) : 0;
	else if (obj->cursed) chance = (chance == 0) ? rn2(4) : 4;
	/* 0,1,2,3,4:  b=80%,5,5,5,5; nc=20%,20,20,20,20; c=5%,5,5,5,80 */

	switch (chance) {
	case 0 : verbalize("I am in your debt.  I will grant one wish!");
		makewish(FALSE);
		mongone(mtmp);
		break;
	case 1 : verbalize("Thank you for freeing me!");
		tamedog(mtmp, NULL);
		break;
	case 2 : verbalize("You freed me!");
		mtmp->mpeaceful = TRUE;
		set_malign(mtmp);
		break;
	case 3 : verbalize("It is about time!");
		pline("%s vanishes.", Monnam(mtmp));
		mongone(mtmp);
		break;
	default: verbalize("You disturbed me, fool!");
		break;
	}
}